

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  RequestBuilder *pRVar1;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  undefined1 local_a0 [8];
  Client client;
  string local_88;
  string local_68;
  string local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  restincurl::Client::Client(&client,true);
  std::make_unique<restincurl::RequestBuilder,restincurl::Worker&>((Worker *)local_a0);
  std::__cxx11::string::string((string *)&local_48,"http://localhost:3001/normal/posts",&local_a1);
  pRVar1 = restincurl::RequestBuilder::Get((RequestBuilder *)local_a0,&local_48);
  pRVar1 = restincurl::RequestBuilder::AcceptJson(pRVar1);
  std::__cxx11::string::string((string *)&local_68,"X-Client",&local_a2);
  std::__cxx11::string::string((string *)&local_88,"restincurl",&local_a3);
  pRVar1 = restincurl::RequestBuilder::Header(pRVar1,&local_68,&local_88);
  pRVar1 = restincurl::RequestBuilder::Trace(pRVar1,true);
  local_28._M_unused._M_object = (_Elt_pointer)0x0;
  local_28._8_8_ = (_Elt_pointer)0x0;
  local_10 = std::
             _Function_handler<void_(const_restincurl::Result_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/tests/app_test.cpp:23:25)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_restincurl::Result_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/tests/app_test.cpp:23:25)>
             ::_M_manager;
  pRVar1 = restincurl::RequestBuilder::WithCompletion(pRVar1,(completion_fn_t *)&local_28);
  restincurl::RequestBuilder::Execute(pRVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>::
  ~unique_ptr((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
               *)local_a0);
  restincurl::Worker::CloseWhenFinished
            ((Worker *)
             client.worker_._M_t.
             super___uniq_ptr_impl<restincurl::Worker,_std::default_delete<restincurl::Worker>_>.
             _M_t.
             super__Tuple_impl<0UL,_restincurl::Worker_*,_std::default_delete<restincurl::Worker>_>.
             super__Head_base<0UL,_restincurl::Worker_*,_false>._M_head_impl);
  restincurl::Worker::Join
            ((Worker *)
             client.worker_._M_t.
             super___uniq_ptr_impl<restincurl::Worker,_std::default_delete<restincurl::Worker>_>.
             _M_t.
             super__Tuple_impl<0UL,_restincurl::Worker_*,_std::default_delete<restincurl::Worker>_>.
             super__Head_base<0UL,_restincurl::Worker_*,_false>._M_head_impl);
  restincurl::Client::~Client(&client);
  return 0;
}

Assistant:

int main( int argc, char * argv[]) {

    restincurl::Client client;

    client.Build()->Get("http://localhost:3001/normal/posts")
        .AcceptJson()
        .Header("X-Client", "restincurl")
        .Trace()
        .WithCompletion([&](const Result& result) {
            clog << "In callback! HTTP result code was " << result.http_response_code << endl;
            clog << "Data was " << result.body.size() << " bytes." << endl;
        })
        .Execute();

    // If the client goes out of scope, it will terminate all ongoing
    // requests, so we need to wait here for the request to finish.

    // Tell client that we want to close when the request is finish
    client.CloseWhenFinished();

    // Wait for the worker-thread in the client to quit
    client.WaitForFinish();
}